

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shufflechannel.cpp
# Opt level: O3

int __thiscall
ncnn::ShuffleChannel::forward(ShuffleChannel *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int _w;
  int _h;
  size_t _elemsize;
  ulong uVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  
  iVar3 = bottom_blob->c;
  uVar1 = (long)iVar3 / (long)this->group;
  iVar2 = (int)uVar1;
  iVar5 = -100;
  if (iVar3 == this->group * iVar2) {
    _w = bottom_blob->w;
    _h = bottom_blob->h;
    _elemsize = bottom_blob->elemsize;
    Mat::create(top_blob,_w,_h,iVar3,_elemsize,opt->blob_allocator);
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      iVar3 = this->group;
      if (iVar3 != 0) {
        lVar7 = 0;
        lVar6 = 0;
        do {
          if (iVar2 != 0) {
            uVar4 = 0;
            do {
              memcpy((void *)(((long)(int)uVar4 * (long)this->group + lVar6) * top_blob->cstep *
                              top_blob->elemsize + (long)top_blob->data),
                     (void *)((lVar7 + uVar4) * bottom_blob->cstep * bottom_blob->elemsize +
                             (long)bottom_blob->data),_elemsize * (long)(_h * _w));
              uVar4 = uVar4 + 1;
            } while ((uVar1 & 0xffffffff) != uVar4);
            iVar3 = this->group;
          }
          lVar6 = lVar6 + 1;
          lVar7 = lVar7 + iVar2;
        } while (iVar3 != (int)lVar6);
      }
      iVar5 = 0;
    }
  }
  return iVar5;
}

Assistant:

int ShuffleChannel::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int c = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int chs_per_group = c / group;

    if (c != chs_per_group * group)
    {
        // reject invalid group
        return -100;
    }

    top_blob.create(w, h, c, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    const size_t feature_sz = w * h * elemsize;
    for (int i = 0; i != group; i++)
    {
        for (int j = 0; j != chs_per_group; j++)
        {
            int src_q = chs_per_group * i + j;
            int dst_q = group * j + i;
            memcpy(top_blob.channel(dst_q), bottom_blob.channel(src_q), feature_sz);
        }
    }
    return 0;
}